

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O0

void __thiscall pg::PPSolver::reportRegion(PPSolver *this,int p)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  reference piVar8;
  _label_vertex _Var9;
  int *piStack_a8;
  int to;
  int *curedge;
  bool got;
  _label_vertex local_88;
  Game *local_78;
  int local_70;
  _label_vertex local_68;
  Game *local_58;
  int local_50;
  _label_vertex local_48;
  int local_34;
  iterator iStack_30;
  int n;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int pl;
  int p_local;
  PPSolver *this_local;
  
  poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion \x1b[36m");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,p);
  std::operator<<(poVar7,"\x1b[m");
  pvVar1 = this->regions;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar1 + p);
  iStack_30 = std::vector<int,_std::allocator<int>_>::end(pvVar1 + p);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0), bVar2) {
    piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    local_34 = *piVar8;
    if (this->region[local_34] == p) {
      poVar7 = std::operator<<((this->super_Solver).logger," \x1b[37m");
      _Var9 = Solver::label_vertex(&this->super_Solver,local_34);
      local_58 = _Var9.g;
      local_50 = _Var9.v;
      local_48.g = local_58;
      local_48.v = local_50;
      poVar7 = operator<<(poVar7,&local_48);
      std::operator<<(poVar7,"\x1b[m");
    }
    uVar4 = Solver::owner(&this->super_Solver,local_34);
    if (uVar4 == (p & 1U)) {
      if (this->strategy[local_34] == -1) {
        iVar5 = Solver::priority(&this->super_Solver,local_34);
        if (iVar5 != p) {
          std::operator<<((this->super_Solver).logger,"\x1b[31;1m--\x1b[m");
        }
      }
      else {
        bVar2 = bitset::operator[]((this->super_Solver).disabled,(long)this->strategy[local_34]);
        if ((bVar2) || (this->region[this->strategy[local_34]] != p)) {
          poVar7 = std::operator<<((this->super_Solver).logger,"->\x1b[31;1m");
          _Var9 = Solver::label_vertex(&this->super_Solver,this->strategy[local_34]);
          local_78 = _Var9.g;
          local_70 = _Var9.v;
          local_68.g = local_78;
          local_68.v = local_70;
          poVar7 = operator<<(poVar7,&local_68);
          std::operator<<(poVar7,"\x1b[m");
        }
        else {
          poVar7 = std::operator<<((this->super_Solver).logger,"->");
          _Var9 = Solver::label_vertex(&this->super_Solver,this->strategy[local_34]);
          local_88.g = _Var9.g;
          local_88.v = _Var9.v;
          operator<<(poVar7,&local_88);
        }
      }
    }
    else {
      bVar2 = false;
      for (piStack_a8 = Solver::outs(&this->super_Solver,local_34); *piStack_a8 != -1;
          piStack_a8 = piStack_a8 + 1) {
        iVar5 = *piStack_a8;
        bVar3 = bitset::operator[]((this->super_Solver).disabled,(long)iVar5);
        if (((!bVar3) && (this->region[iVar5] != -2)) && (this->region[iVar5] != p)) {
          if (bVar2) {
            std::operator<<((this->super_Solver).logger,",");
          }
          else {
            std::operator<<((this->super_Solver).logger,"(");
          }
          bVar2 = true;
          if (this->region[iVar5] < p) {
            iVar6 = Solver::priority(&this->super_Solver,local_34);
            if (iVar6 == p) {
              poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[36m");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->region[iVar5]);
              std::operator<<(poVar7,"\x1b[m");
            }
            else {
              std::operator<<((this->super_Solver).logger,"\x1b[31;1mesc\x1b[m");
            }
          }
          else {
            poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[36m");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->region[iVar5]);
            std::operator<<(poVar7,"\x1b[m");
          }
        }
      }
      if (bVar2) {
        std::operator<<((this->super_Solver).logger,")");
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
PPSolver::reportRegion(int p)
{
    const int pl = p&1;
    logger << "\033[1;33mregion \033[36m" << p << "\033[m";
    for (int n : regions[p]) {
        if (region[n] == p) logger << " \033[37m" << label_vertex(n) << "\033[m";
        if (owner(n) == pl) {
            if (strategy[n] == -1) {
                if (priority(n) != p) logger << "\033[31;1m--\033[m";
            } else {
                if (disabled[strategy[n]] or region[strategy[n]] != p) logger << "->\033[31;1m" << label_vertex(strategy[n]) << "\033[m";
                else logger << "->" << label_vertex(strategy[n]);
            }
        } else {
            bool got = false;
            for (auto curedge = outs(n); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                if (region[to] == -2) continue;
                if (region[to] == p) continue;
                if (!got) logger << "(";
                else logger << ",";
                got = true;
                if (region[to] < p) {
                    if (priority(n) != p) logger << "\033[31;1mesc\033[m";
                    else logger << "\033[36m" << region[to] << "\033[m";
                } else logger << "\033[36m" << region[to] << "\033[m";
            }
            if (got) logger << ")";
        }
    }
    logger << std::endl;
}